

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O2

void http_s_new(http_s *h,http_fio_protocol_s *owner,http_vtable_s *vtbl)

{
  FIOBJ FVar1;
  FIOBJ FVar2;
  timespec tVar3;
  
  FVar1 = fiobj_hash_new();
  tVar3 = fio_last_tick();
  FVar2 = fiobj_hash_new();
  (h->private_data).vtbl = vtbl;
  (h->private_data).flag = (uintptr_t)owner;
  (h->private_data).out_headers = FVar1;
  h->received_at = tVar3;
  h->method = 0;
  h->status_str = 0;
  h->version = 0;
  h->status = 200;
  h->path = 0;
  h->query = 0;
  h->headers = FVar2;
  h->cookies = 0;
  h->params = 0;
  h->body = 0;
  h->udata = (void *)0x0;
  return;
}

Assistant:

static inline void http_s_new(http_s *h, http_fio_protocol_s *owner,
                              http_vtable_s *vtbl) {
  *h = (http_s){
      .private_data =
          {
              .vtbl = vtbl,
              .flag = (uintptr_t)owner,
              .out_headers = fiobj_hash_new(),
          },
      .headers = fiobj_hash_new(),
      .received_at = fio_last_tick(),
      .status = 200,
  };
}